

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

void absl::StrAppend(Nonnull<std::string_*> dest,AlphaNum *a)

{
  size_type sVar1;
  Nullable<const_char_*> pcVar2;
  long lVar3;
  AlphaNum *pAVar4;
  Nonnull<char_*> pcVar5;
  long lVar6;
  ulong in_RDI;
  char *out;
  char *begin;
  size_type old_size;
  ulong to_append;
  string *in_stack_ffffffffffffffb0;
  AlphaNum *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar7;
  
  sVar1 = AlphaNum::size((AlphaNum *)0x3a6588);
  uVar7 = true;
  if (sVar1 != 0) {
    pcVar2 = AlphaNum::data((AlphaNum *)0x3a65a1);
    lVar3 = std::__cxx11::string::data();
    in_stack_ffffffffffffffc8 = (AlphaNum *)(pcVar2 + -lVar3);
    pAVar4 = (AlphaNum *)std::__cxx11::string::size();
    uVar7 = pAVar4 < in_stack_ffffffffffffffc8;
  }
  if ((bool)uVar7 == false) {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xbb,"void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &)");
  }
  std::__cxx11::string::size();
  to_append = in_RDI;
  AlphaNum::size((AlphaNum *)0x3a6629);
  anon_unknown_5::STLStringAppendUninitializedAmortized(in_stack_ffffffffffffffb0,to_append);
  lVar3 = std::__cxx11::string::operator[](in_RDI);
  pcVar5 = anon_unknown_5::Append
                     ((Nonnull<char_*>)CONCAT17(uVar7,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8);
  lVar6 = std::__cxx11::string::size();
  if (pcVar5 == (Nonnull<char_*>)(lVar3 + lVar6)) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                ,0xc1,"void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &)");
}

Assistant:

void StrAppend(absl::Nonnull<std::string*> dest, const AlphaNum& a) {
  ASSERT_NO_OVERLAP(*dest, a);
  std::string::size_type old_size = dest->size();
  STLStringAppendUninitializedAmortized(dest, a.size());
  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  out = Append(out, a);
  assert(out == begin + dest->size());
}